

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless.c
# Opt level: O0

void VP8LConvertBGRAToBGR_C(uint32_t *src,int num_pixels,uint8_t *dst)

{
  uint32_t uVar1;
  uint8_t *puVar2;
  uint32_t argb;
  uint32_t *src_end;
  uint8_t *dst_local;
  int num_pixels_local;
  uint32_t *src_local;
  
  dst_local = dst;
  src_local = src;
  while (src_local < src + num_pixels) {
    uVar1 = *src_local;
    *dst_local = (uint8_t)uVar1;
    puVar2 = dst_local + 2;
    dst_local[1] = (uint8_t)(uVar1 >> 8);
    dst_local = dst_local + 3;
    *puVar2 = (uint8_t)(uVar1 >> 0x10);
    src_local = src_local + 1;
  }
  return;
}

Assistant:

void VP8LConvertBGRAToBGR_C(const uint32_t* src,
                            int num_pixels, uint8_t* dst) {
  const uint32_t* const src_end = src + num_pixels;
  while (src < src_end) {
    const uint32_t argb = *src++;
    *dst++ = (argb >>  0) & 0xff;
    *dst++ = (argb >>  8) & 0xff;
    *dst++ = (argb >> 16) & 0xff;
  }
}